

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PFileReceiver.cpp
# Opt level: O0

void __thiscall
FileReceiverServerConnection::OnClose(FileReceiverServerConnection *this,SDKJsonResult *reason)

{
  LogStringBuffer buffer;
  SDKJsonResult *in_stack_fffffffffffffb48;
  LogStringBuffer *in_stack_fffffffffffffb50;
  LogStringBuffer *buffer_00;
  Channel *this_00;
  string local_458 [82];
  undefined1 auStack_406 [102];
  char *local_3a0;
  LogStringBuffer *local_398;
  char *local_390;
  Channel *local_388;
  string *local_380;
  char *local_378;
  LogStringBuffer *local_370;
  char *local_368;
  undefined4 local_35c;
  Channel *local_358;
  undefined4 local_34c;
  Channel *local_348;
  undefined1 local_330 [16];
  ostream aoStack_320 [376];
  string *local_1a8;
  char *local_1a0;
  LogStringBuffer *local_198;
  char *local_190;
  undefined4 local_184;
  Channel *local_180;
  string *local_178;
  char *local_170;
  LogStringBuffer *local_168;
  char *local_160;
  undefined8 local_158;
  undefined1 *local_150;
  Channel *local_148;
  undefined8 local_140;
  undefined1 *local_138;
  Channel *local_130;
  undefined8 local_128;
  undefined1 *local_120;
  string *local_118;
  char *local_110;
  LogStringBuffer *local_108;
  char *local_100;
  undefined1 *local_f8;
  Channel *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  Channel *local_d8;
  string *local_d0;
  char *local_c8;
  LogStringBuffer *local_c0;
  undefined1 *local_b8;
  Channel *local_b0;
  LogStringBuffer *local_a8;
  undefined1 *local_a0;
  Channel *local_98;
  LogStringBuffer *local_90;
  undefined1 *local_88;
  char *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  Channel *local_58;
  char *local_50;
  undefined1 *local_48;
  Channel *local_40;
  string *local_38;
  undefined1 *local_30;
  Channel *local_28;
  string *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  tonk::SDKConnection::GetStatusEx((SDKConnection *)in_stack_fffffffffffffb50);
  buffer_00 = (LogStringBuffer *)auStack_406;
  tonk::SDKJsonResult::ToString_abi_cxx11_(in_stack_fffffffffffffb48);
  local_388 = &Logger;
  local_390 = "Rendezvous server connection closed: ";
  local_3a0 = ", Reason: ";
  auStack_406._94_8_ = local_458;
  local_358 = &Logger;
  local_35c = 2;
  local_368 = "Rendezvous server connection closed: ";
  local_378 = ", Reason: ";
  this_00 = &Logger;
  local_348 = &Logger;
  local_34c = 2;
  local_398 = buffer_00;
  local_380 = (string *)auStack_406._94_8_;
  local_370 = buffer_00;
  if ((int)Logger.ChannelMinLevel < 3) {
    local_180 = &Logger;
    local_184 = 2;
    local_190 = "Rendezvous server connection closed: ";
    local_1a0 = ", Reason: ";
    local_1a8 = (string *)auStack_406._94_8_;
    local_198 = buffer_00;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffb50,(char *)in_stack_fffffffffffffb48,Trace);
    local_158 = 0x119318;
    local_148 = &Logger;
    local_150 = local_330;
    local_160 = local_190;
    local_168 = local_198;
    local_170 = local_1a0;
    local_178 = local_1a8;
    local_130 = &Logger;
    local_140 = local_158;
    local_138 = local_150;
    local_128 = local_158;
    local_120 = local_150;
    std::operator<<(aoStack_320,(string *)&Logger.Prefix);
    local_f0 = &Logger;
    local_f8 = local_150;
    local_100 = local_160;
    local_108 = local_168;
    local_110 = local_170;
    local_118 = local_178;
    local_d8 = &Logger;
    local_e0 = local_150;
    local_e8 = local_160;
    local_78 = local_150;
    local_80 = local_160;
    std::operator<<((ostream *)(local_150 + 0x10),local_160);
    local_b0 = &Logger;
    local_b8 = local_f8;
    local_c0 = local_108;
    local_c8 = local_110;
    local_d0 = local_118;
    local_98 = &Logger;
    local_a0 = local_f8;
    local_a8 = local_108;
    local_88 = local_f8;
    local_90 = local_108;
    std::operator<<((ostream *)(local_f8 + 0x10),(char *)local_108);
    local_58 = &Logger;
    local_60 = local_b8;
    local_68 = local_c8;
    local_70 = local_d0;
    local_40 = &Logger;
    local_48 = local_b8;
    local_50 = local_c8;
    local_8 = local_b8;
    local_10 = local_c8;
    std::operator<<((ostream *)(local_b8 + 0x10),local_c8);
    local_28 = &Logger;
    local_30 = local_60;
    local_38 = local_70;
    local_18 = local_60;
    local_20 = local_70;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write((OutputWorker *)this_00,buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x103e51);
  }
  std::__cxx11::string::~string(local_458);
  return;
}

Assistant:

void FileReceiverServerConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    Logger.Info("Rendezvous server connection closed: ",
        GetStatusEx().Remote.NetworkString, ", Reason: ", reason.ToString());
}